

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_can.c
# Opt level: O1

int csp_can2_tx(csp_iface_t *iface,uint16_t via,csp_packet_t *packet,int from_me)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  size_t __n;
  uint32_t frame_buf_mem [2];
  uint local_38;
  undefined1 local_34 [4];
  
  uVar2 = (packet->id).dst;
  uVar3 = iface->addr;
  if (uVar2 == uVar3) {
    iVar8 = 0;
    csp_qfifo_write(packet,iface,(void *)0x0);
  }
  else {
    puVar5 = (uint *)iface->interface_data;
    uVar6 = *puVar5;
    *puVar5 = uVar6 + 1;
    bVar1 = (packet->id).pri;
    uVar10 = (uVar6 & 3) * 0x20;
    uVar6 = (uint)(packet->id).src << 0x12;
    uVar9 = ((packet->id).dport & 0x3f) << 0xc | uVar6;
    uVar7 = ((packet->id).sport & 0x3f) << 6 | uVar9;
    local_38 = uVar6 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
               ((packet->id).flags & 0x3f | uVar7) << 0x18;
    uVar4 = packet->length;
    uVar6 = 4;
    __n = (size_t)(uint)uVar4;
    if (3 < uVar4) {
      __n = 4;
    }
    memcpy(local_34,&packet->field_5,__n);
    iVar8 = (**(code **)(puVar5 + 2))
                      (iface->driver_data,
                       uVar10 + ((uint)((uint)__n == (uint)uVar4) |
                                (uVar3 & 0x3f) << 7 | (uVar2 & 0x3fff) << 0xd | (bVar1 & 3) << 0x1b)
                       + 2,&local_38,(uint)__n + 4 & 0xff);
    while (iVar8 == 0) {
      uVar2 = packet->length;
      iVar11 = (int)__n;
      uVar7 = (uint)uVar2 - iVar11;
      if (uVar7 == 0 || (int)(uint)uVar2 < iVar11) {
        csp_buffer_free(packet);
        return 0;
      }
      uVar9._0_2_ = iface->addr;
      uVar9._2_2_ = iface->netmask;
      if (7 < (int)uVar7) {
        uVar7 = 8;
      }
      iVar8 = (**(code **)(puVar5 + 2))
                        (iface->driver_data,
                         (uint)(uVar7 + iVar11 == (uint)uVar2) |
                         uVar6 & 0x1c |
                         (uVar9 & 0x3f) << 7 |
                         ((packet->id).dst & 0x3fff) << 0xd | ((packet->id).pri & 3) << 0x1b |
                         uVar10,(long)iVar11 + (long)&packet->field_5,uVar7 & 0xff);
      uVar6 = uVar6 + 4;
      __n = (size_t)(uVar7 + iVar11);
    }
    iface->tx_error = iface->tx_error + 1;
    iVar8 = -0xb;
  }
  return iVar8;
}

Assistant:

int csp_can2_tx(csp_iface_t * iface, uint16_t via, csp_packet_t * packet, int from_me) {

	/* Loopback */
	if (packet->id.dst == iface->addr) {
		csp_qfifo_write(packet, iface, NULL);
		return CSP_ERR_NONE;
	}

	csp_can_interface_data_t * ifdata = iface->interface_data;

	/* Setup counters */
	int sender_count = ifdata->cfp_packet_counter++;
	int tx_count = 0;

	uint32_t can_id = 0;
	uint8_t frame_buf_inp = 0;

	/* Pack mandatory fields of header */
	can_id = (((packet->id.pri & CFP2_PRIO_MASK) << CFP2_PRIO_OFFSET) |
			  ((packet->id.dst & CFP2_DST_MASK) << CFP2_DST_OFFSET) |
			  ((iface->addr & CFP2_SENDER_MASK) << CFP2_SENDER_OFFSET) |
			  ((sender_count & CFP2_SC_MASK) << CFP2_SC_OFFSET) |
			  ((1 & CFP2_BEGIN_MASK) << CFP2_BEGIN_OFFSET));

	/* Pack the rest of the CSP header in the first 32-bit of data */
    uint32_t frame_buf_mem[(CAN_FRAME_SIZE+sizeof(uint32_t)-1)/sizeof(uint32_t)];
    uint8_t *frame_buf = (uint8_t*)frame_buf_mem;
	uint32_t * header_extension = (uint32_t *)frame_buf_mem;

	*header_extension = (((packet->id.src & CFP2_SRC_MASK) << CFP2_SRC_OFFSET) |
						 ((packet->id.dport & CFP2_DPORT_MASK) << CFP2_DPORT_OFFSET) |
						 ((packet->id.sport & CFP2_SPORT_MASK) << CFP2_SPORT_OFFSET) |
						 ((packet->id.flags & CFP2_FLAGS_MASK) << CFP2_FLAGS_OFFSET));

	/* Convert to network byte order */
	*header_extension = htobe32(*header_extension);

	frame_buf_inp += 4;

	/* Copy first bytes of data field (max 4) */
	int data_bytes = (packet->length >= 4) ? 4 : packet->length;
	memcpy(frame_buf + frame_buf_inp, packet->data, data_bytes);
	frame_buf_inp += data_bytes;
	tx_count = data_bytes;

	/* Check for end condition */
	if (tx_count == packet->length) {
		can_id |= ((1 & CFP2_END_MASK) << CFP2_END_OFFSET);
	}

	/* Send first frame now */
	if ((ifdata->tx_func)(iface->driver_data, can_id, frame_buf, frame_buf_inp) != CSP_ERR_NONE) {
		iface->tx_error++;
		/* Does not free on return */
		return CSP_ERR_DRIVER;
	}

	/* Send next fragments if not complete */
	int fragment_count = 1;
	while (tx_count < packet->length) {

		/* Pack mandatory fields of header */
		can_id = (((packet->id.pri & CFP2_PRIO_MASK) << CFP2_PRIO_OFFSET) |
				  ((packet->id.dst & CFP2_DST_MASK) << CFP2_DST_OFFSET) |
				  ((iface->addr & CFP2_SENDER_MASK) << CFP2_SENDER_OFFSET) |
				  ((sender_count & CFP2_SC_MASK) << CFP2_SC_OFFSET));

		/* Set and increment fragment count */
		can_id |= (fragment_count++ & CFP2_FC_MASK) << CFP2_FC_OFFSET;

		/* Calculate frame data bytes */
		data_bytes = (packet->length - tx_count >= CAN_FRAME_SIZE) ? CAN_FRAME_SIZE : packet->length - tx_count;

		/* Check for end condition */
		if (tx_count + data_bytes == packet->length) {
			can_id |= ((1 & CFP2_END_MASK) << CFP2_END_OFFSET);
		}

		/* Send frame */
		if ((ifdata->tx_func)(iface->driver_data, can_id, packet->data + tx_count, data_bytes) != CSP_ERR_NONE) {
			iface->tx_error++;
			/* Does not free on return */
			return CSP_ERR_DRIVER;
		}

		/* Increment tx counter */
		tx_count += data_bytes;
	}

	csp_buffer_free(packet);

	return CSP_ERR_NONE;
}